

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::ReaderArena::~ReaderArena(ReaderArena *this)

{
  ReaderArena *this_local;
  
  ~ReaderArena(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

ReaderArena::~ReaderArena() noexcept(false) {}